

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::JavascriptFunction::GetDisplayNameImpl(JavascriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionProxy *pFVar3;
  undefined4 *puVar4;
  char16 *name_00;
  JavascriptString *pJVar5;
  char16 *name;
  ParseableFunctionInfo *pPStack_18;
  charcount_t length;
  ParseableFunctionInfo *func;
  JavascriptFunction *this_local;
  
  func = (ParseableFunctionInfo *)this;
  pFVar3 = GetFunctionProxy(this);
  if (pFVar3 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc86,"(this->GetFunctionProxy() != nullptr)",
                                "this->GetFunctionProxy() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionProxy(this);
  pPStack_18 = FunctionProxy::EnsureDeserialized(pFVar3);
  name._4_4_ = 0;
  name_00 = FunctionProxy::GetShortDisplayName
                      (&pPStack_18->super_FunctionProxy,(charcount_t *)((long)&name + 4));
  pJVar5 = DisplayNameHelper(this,name_00,name._4_4_);
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptFunction::GetDisplayNameImpl() const
    {
        Assert(this->GetFunctionProxy() != nullptr); // The caller should guarantee a proxy exists
        ParseableFunctionInfo * func = this->GetFunctionProxy()->EnsureDeserialized();
        charcount_t length = 0;
        const char16* name = func->GetShortDisplayName(&length);

        return DisplayNameHelper(name, length);
    }